

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::AssertionItemPortListSyntax::getChild(AssertionItemPortListSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  long in_RDX;
  long in_RSI;
  ConstTokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff98;
  Info *in_stack_ffffffffffffffa0;
  nullptr_t in_stack_ffffffffffffffa8;
  
  if (in_RDX == 0) {
    token.info = in_stack_ffffffffffffffa0;
    token._0_8_ = in_stack_ffffffffffffff98;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x45fa3b,token);
  }
  else if (in_RDX == 1) {
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)(in_RSI + 0x28),in_stack_ffffffffffffff98);
  }
  else if (in_RDX == 2) {
    token_00.info = in_stack_ffffffffffffffa0;
    token_00._0_8_ = in_stack_ffffffffffffff98;
    ConstTokenOrSyntax::ConstTokenOrSyntax((ConstTokenOrSyntax *)0x45faa2,token_00);
  }
  else {
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_RDI,in_stack_ffffffffffffffa8);
  }
  return in_RDI;
}

Assistant:

ConstTokenOrSyntax AssertionItemPortListSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return openParen;
        case 1: return &ports;
        case 2: return closeParen;
        default: return nullptr;
    }
}